

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O3

void __thiscall CoreML::Specification::Model::clear_knearestneighborsclassifier(Model *this)

{
  ulong uVar1;
  KNearestNeighborsClassifier *this_00;
  undefined8 *puVar2;
  
  if (this->_oneof_case_[0] == 0x194) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 == (undefined8 *)0x0) {
      this_00 = (this->Type_).knearestneighborsclassifier_;
      if (this_00 != (KNearestNeighborsClassifier *)0x0) {
        KNearestNeighborsClassifier::~KNearestNeighborsClassifier(this_00);
      }
      operator_delete(this_00,0x48);
    }
    this->_oneof_case_[0] = 0;
  }
  return;
}

Assistant:

inline bool Model::_internal_has_knearestneighborsclassifier() const {
  return Type_case() == kKNearestNeighborsClassifier;
}